

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

QDomNodePrivate * __thiscall
QDomDocumentTypePrivate::insertAfter
          (QDomDocumentTypePrivate *this,QDomNodePrivate *newChild,QDomNodePrivate *refChild)

{
  int iVar1;
  QDomNamedNodeMapPrivate *pQVar2;
  long in_FS_OFFSET;
  QDomNodePrivate *p;
  iterator iStack_48;
  QString local_30;
  QDomNodePrivate *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = QDomNodePrivate::insertAfter(&this->super_QDomNodePrivate,newChild,refChild);
  if (local_18 == (QDomNodePrivate *)0x0) {
LAB_00111572:
    if (local_18 == (QDomNodePrivate *)0x0) goto LAB_001115f0;
    iVar1 = (*local_18->_vptr_QDomNodePrivate[0xb])();
    if (iVar1 != 0xc) goto LAB_001115f0;
    pQVar2 = this->notations;
  }
  else {
    iVar1 = (*local_18->_vptr_QDomNodePrivate[0xb])(local_18);
    if (iVar1 != 6) goto LAB_00111572;
    pQVar2 = this->entities;
  }
  local_30.d.d = (local_18->name).d.d;
  local_30.d.ptr = (local_18->name).d.ptr;
  local_30.d.size = (local_18->name).d.size;
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_30.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_30.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QMultiHash<QString,QDomNodePrivate*>::emplace<QDomNodePrivate*const&>
            (&iStack_48,&pQVar2->map,&local_30,&local_18);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_001115f0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

QDomNodePrivate* QDomDocumentTypePrivate::insertAfter(QDomNodePrivate* newChild, QDomNodePrivate* refChild)
{
    // Call the original implementation
    QDomNodePrivate* p = QDomNodePrivate::insertAfter(newChild, refChild);
    // Update the maps
    if (p && p->isEntity())
        entities->map.insert(p->nodeName(), p);
    else if (p && p->isNotation())
        notations->map.insert(p->nodeName(), p);

    return p;
}